

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

void __thiscall Omega_h::InputMap::set(InputMap *this,string *name,char *value)

{
  InputScalar *this_00;
  shared_ptr<Omega_h::Input> sptr;
  allocator local_59;
  shared_ptr<Omega_h::Input> local_58;
  string local_48;
  
  this_00 = (InputScalar *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_48,value,&local_59);
  InputScalar::InputScalar(this_00,&local_48);
  local_58.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputScalar*>
            (&local_58.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  add(this,name,&local_58);
  if (local_58.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void InputMap::set(std::string const& name, char const* value) {
  std::shared_ptr<Input> sptr(new InputScalar(value));
  this->add(name, std::move(sptr));
}